

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Geometry.cpp
# Opt level: O1

void __thiscall Assimp::AMFImporter::ParseNode_Volume(AMFImporter *this)

{
  size_t *psVar1;
  char *pcVar2;
  CAMFImporter_NodeElement *pCVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  char *__s;
  undefined4 extraout_var_01;
  CAMFImporter_NodeElement *pNode;
  _List_node_base *p_Var7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  char *__end;
  undefined1 **ppuVar10;
  uint uVar11;
  ulong uVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  string an;
  string materialid;
  string type;
  string local_b8;
  uint local_94;
  undefined1 *local_90;
  undefined8 local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  string local_50;
  undefined4 extraout_var_00;
  
  local_90 = &local_80;
  local_88 = 0;
  local_80 = 0;
  local_70 = &local_60;
  local_68 = 0;
  local_60 = 0;
  uVar4 = (*this->mReader->_vptr_IIrrXMLReader[4])();
  if (0 < (int)uVar4) {
    uVar12 = 0;
    local_94 = uVar4;
    do {
      iVar5 = (*this->mReader->_vptr_IIrrXMLReader[5])(this->mReader,uVar12);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,(char *)CONCAT44(extraout_var,iVar5),
                 (allocator<char> *)&local_50);
      iVar5 = std::__cxx11::string::compare((char *)&local_b8);
      if (iVar5 == 0) {
        iVar5 = (*this->mReader->_vptr_IIrrXMLReader[6])();
        __s = (char *)CONCAT44(extraout_var_00,iVar5);
        ppuVar10 = &local_90;
LAB_003ef961:
        pcVar2 = ppuVar10[1];
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)ppuVar10,0,pcVar2,(ulong)__s);
        uVar4 = local_94;
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)&local_b8);
        if (iVar5 == 0) {
          iVar5 = (*this->mReader->_vptr_IIrrXMLReader[6])();
          __s = (char *)CONCAT44(extraout_var_01,iVar5);
          ppuVar10 = &local_70;
          goto LAB_003ef961;
        }
        Throw_IncorrectAttr(this,&local_b8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      uVar11 = (int)uVar12 + 1;
      uVar12 = (ulong)uVar11;
    } while (uVar4 != uVar11);
  }
  pNode = (CAMFImporter_NodeElement *)operator_new(0x90);
  pCVar3 = this->mNodeElement_Cur;
  pNode->Type = ENET_Volume;
  (pNode->ID)._M_dataplus._M_p = (pointer)&(pNode->ID).field_2;
  (pNode->ID)._M_string_length = 0;
  (pNode->ID).field_2._M_local_buf[0] = '\0';
  pNode->Parent = pCVar3;
  (pNode->Child).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
  (pNode->Child).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  (pNode->Child).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)&pNode->Child;
  (pNode->Child).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&pNode->Child;
  (pNode->Child).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node._M_size = 0;
  pNode->_vptr_CAMFImporter_NodeElement =
       (_func_int **)&PTR__CAMFImporter_NodeElement_Volume_0082e378;
  pNode[1]._vptr_CAMFImporter_NodeElement = (_func_int **)&pNode[1].ID;
  *(undefined8 *)&pNode[1].Type = 0;
  *(undefined1 *)&pNode[1].ID._M_dataplus._M_p = 0;
  pNode[1].ID.field_2._M_allocated_capacity = (size_type)&pNode[1].Parent;
  *(undefined8 *)((long)&pNode[1].ID.field_2 + 8) = 0;
  *(undefined1 *)&pNode[1].Parent = 0;
  std::__cxx11::string::_M_assign((string *)(pNode + 1));
  std::__cxx11::string::_M_assign((string *)pNode[1].ID.field_2._M_local_buf);
  iVar5 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((char)iVar5 == '\0') {
    ParseHelper_Node_Enter(this,pNode);
    local_94 = 0;
    do {
      do {
        while( true ) {
          paVar13 = &local_b8.field_2;
          iVar5 = (*this->mReader->_vptr_IIrrXMLReader[2])();
          if ((char)iVar5 == '\0') goto LAB_003efd2b;
          iVar6 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          if (iVar6 != 1) break;
          local_b8._M_dataplus._M_p = (pointer)paVar13;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"color","");
          (*this->mReader->_vptr_IIrrXMLReader[0xd])();
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)std::__cxx11::string::compare((char *)&local_b8);
          paVar9 = paVar8;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != paVar13) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
            paVar9 = extraout_RAX;
          }
          if ((int)paVar8 == 0) {
            if ((local_94 & 1) != 0) {
              local_b8._M_dataplus._M_p = (pointer)paVar13;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"color","");
              local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_50,"Only one color can be defined for <volume>.","");
              Throw_MoreThanOnceDefined(this,&local_b8,&local_50);
              paVar9 = &local_50.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != paVar9) {
                operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1
                               );
                paVar9 = extraout_RAX_00;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p != paVar13) {
                operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1
                               );
                paVar9 = extraout_RAX_01;
              }
            }
            local_94 = (uint)CONCAT71((int7)((ulong)paVar9 >> 8),1);
            ParseNode_Color(this);
          }
          else {
            local_b8._M_dataplus._M_p = (pointer)paVar13;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"triangle","");
            (*this->mReader->_vptr_IIrrXMLReader[0xd])();
            iVar5 = std::__cxx11::string::compare((char *)&local_b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != paVar13) {
              operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
            }
            if (iVar5 == 0) {
              ParseNode_Triangle(this);
            }
            else {
              local_b8._M_dataplus._M_p = (pointer)paVar13;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"metadata","");
              (*this->mReader->_vptr_IIrrXMLReader[0xd])();
              iVar5 = std::__cxx11::string::compare((char *)&local_b8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p != paVar13) {
                operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1
                               );
              }
              if (iVar5 == 0) {
                ParseNode_Metadata(this);
              }
              else {
                local_b8._M_dataplus._M_p = (pointer)paVar13;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"volume","");
                XML_CheckNode_SkipUnsupported(this,&local_b8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p != paVar13) {
                  operator_delete(local_b8._M_dataplus._M_p,
                                  local_b8.field_2._M_allocated_capacity + 1);
                }
              }
            }
          }
        }
        iVar6 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      } while (iVar6 != 2);
      local_b8._M_dataplus._M_p = (pointer)paVar13;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"volume","");
      (*this->mReader->_vptr_IIrrXMLReader[0xd])();
      iVar6 = std::__cxx11::string::compare((char *)&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
    } while (iVar6 != 0);
    if ((char)iVar5 == '\0') {
LAB_003efd2b:
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"volume","");
      Throw_CloseNotFound(this,&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
    }
    ParseHelper_Node_Exit(this);
  }
  else {
    pCVar3 = this->mNodeElement_Cur;
    p_Var7 = (_List_node_base *)operator_new(0x18);
    p_Var7[1]._M_next = (_List_node_base *)pNode;
    std::__detail::_List_node_base::_M_hook(p_Var7);
    psVar1 = &(pCVar3->Child).
              super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  p_Var7 = (_List_node_base *)operator_new(0x18);
  p_Var7[1]._M_next = (_List_node_base *)pNode;
  std::__detail::_List_node_base::_M_hook(p_Var7);
  psVar1 = &(this->mNodeElement_List).
            super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
  }
  return;
}

Assistant:

void AMFImporter::ParseNode_Volume()
{
std::string materialid;
std::string type;
CAMFImporter_NodeElement* ne;

	// Read attributes for node <color>.
	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECK_RET("materialid", materialid, mReader->getAttributeValue);
		MACRO_ATTRREAD_CHECK_RET("type", type, mReader->getAttributeValue);
	MACRO_ATTRREAD_LOOPEND;

	// create new object.
	ne = new CAMFImporter_NodeElement_Volume(mNodeElement_Cur);
	// and assign read data
	((CAMFImporter_NodeElement_Volume*)ne)->MaterialID = materialid;
	((CAMFImporter_NodeElement_Volume*)ne)->Type = type;
	// Check for child nodes
	if(!mReader->isEmptyElement())
	{
		bool col_read = false;

		ParseHelper_Node_Enter(ne);
		MACRO_NODECHECK_LOOPBEGIN("volume");
			if(XML_CheckNode_NameEqual("color"))
			{
				// Check if data already defined.
				if(col_read) Throw_MoreThanOnceDefined("color", "Only one color can be defined for <volume>.");
				// read data and set flag about it
				ParseNode_Color();
				col_read = true;

				continue;
			}

			if(XML_CheckNode_NameEqual("triangle")) { ParseNode_Triangle(); continue; }
			if(XML_CheckNode_NameEqual("metadata")) { ParseNode_Metadata(); continue; }
		MACRO_NODECHECK_LOOPEND("volume");
		ParseHelper_Node_Exit();
	}// if(!mReader->isEmptyElement())
	else
	{
		mNodeElement_Cur->Child.push_back(ne);// Add element to child list of current element
	}// if(!mReader->isEmptyElement()) else

	mNodeElement_List.push_back(ne);// and to node element list because its a new object in graph.
}